

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestRegistry::getMatchingTestCases
          (TestRegistry *this,string *rawTestSpec,
          vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_> *matchingTestsOut)

{
  bool bVar1;
  reference pTVar2;
  __normal_iterator<const_Catch::TestCaseInfo_*,_std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>_>
  local_58;
  const_iterator itEnd;
  const_iterator it;
  TestCaseFilter filter;
  vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_> *matchingTestsOut_local;
  string *rawTestSpec_local;
  TestRegistry *this_local;
  
  TestCaseFilter::TestCaseFilter((TestCaseFilter *)&it,rawTestSpec,AutoDetectBehaviour);
  itEnd = std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>::begin
                    (&this->m_functionsInOrder);
  local_58._M_current =
       (TestCaseInfo *)
       std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>::end
                 (&this->m_functionsInOrder);
  while (bVar1 = __gnu_cxx::operator!=(&itEnd,&local_58), bVar1) {
    pTVar2 = __gnu_cxx::
             __normal_iterator<const_Catch::TestCaseInfo_*,_std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>_>
             ::operator*(&itEnd);
    bVar1 = TestCaseFilter::shouldInclude((TestCaseFilter *)&it,pTVar2);
    if (bVar1) {
      pTVar2 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCaseInfo_*,_std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>_>
               ::operator*(&itEnd);
      std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>::push_back
                (matchingTestsOut,pTVar2);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCaseInfo_*,_std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>_>
    ::operator++(&itEnd);
  }
  TestCaseFilter::~TestCaseFilter((TestCaseFilter *)&it);
  return;
}

Assistant:

virtual void getMatchingTestCases( const std::string& rawTestSpec, std::vector<TestCaseInfo>& matchingTestsOut ) const {
            TestCaseFilter filter( rawTestSpec );

            std::vector<TestCaseInfo>::const_iterator it = m_functionsInOrder.begin();
            std::vector<TestCaseInfo>::const_iterator itEnd = m_functionsInOrder.end();
            for(; it != itEnd; ++it ) {
                if( filter.shouldInclude( *it ) ) {
                    matchingTestsOut.push_back( *it );
                }
            }
        }